

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRequiresForSCC
          (Generator *this,GeneratorOptions *options,Printer *printer,SCC *scc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  byte bVar1;
  bool bVar2;
  const_iterator desc_00;
  const_iterator required_00;
  reference ppDVar3;
  Descriptor *pDVar4;
  GeneratorOptions *in_RCX;
  Descriptor *desc;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *__range3;
  bool has_map;
  bool has_extension;
  bool have_message;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwards;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required;
  bool in_stack_000001a5;
  bool in_stack_000001a6;
  bool in_stack_000001a7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001b0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001b8;
  Printer *in_stack_000001c0;
  GeneratorOptions *in_stack_000001c8;
  Generator *in_stack_000001d0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Descriptor *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  bool *in_stack_ffffffffffffff48;
  Descriptor *this_00;
  undefined5 in_stack_ffffffffffffff70;
  byte bVar5;
  byte bVar6;
  undefined1 uVar7;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x463ad9);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x463ae3);
  uVar7 = 0;
  bVar6 = 0;
  bVar5 = 0;
  desc_00 = std::
            vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::begin((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  required_00 = std::
                vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::end((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (__normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)), bVar2
        ) {
    ppDVar3 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
              ::operator*((__normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                           *)&stack0xffffffffffffff60);
    this_00 = *ppDVar3;
    pDVar4 = Descriptor::containing_type(this_00);
    if (pDVar4 == (Descriptor *)0x0) {
      FindRequiresForMessage
                ((Generator *)
                 CONCAT17(uVar7,CONCAT16(bVar6,CONCAT15(bVar5,in_stack_ffffffffffffff70))),in_RCX,
                 (Descriptor *)desc_00._M_current,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)required_00._M_current,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,in_stack_ffffffffffffff48);
      bVar1 = bVar6 & 1;
      bVar6 = true;
      if (bVar1 == 0) {
        in_stack_ffffffffffffff2e =
             anon_unknown_0::HasExtensions
                       ((Descriptor *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
        ;
        bVar6 = in_stack_ffffffffffffff2e;
      }
      bVar1 = bVar5 & 1;
      bVar5 = 1;
      if (bVar1 == 0) {
        in_stack_ffffffffffffff2c =
             anon_unknown_0::HasMap
                       ((GeneratorOptions *)
                        CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffff2e,
                                                CONCAT15(1,CONCAT14(in_stack_ffffffffffffff2c,
                                                                    in_stack_ffffffffffffff28)))),
                        in_stack_ffffffffffffff20);
        bVar5 = in_stack_ffffffffffffff2c;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
    ::operator++((__normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                  *)&stack0xffffffffffffff60);
  }
  GenerateRequiresImpl
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
             in_stack_000001b0,in_stack_000001a8,in_stack_000001a7,in_stack_000001a6,
             in_stack_000001a5);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x463c9d);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x463caa);
  return;
}

Assistant:

void Generator::GenerateRequiresForSCC(const GeneratorOptions& options,
                                       io::Printer* printer, const SCC* scc,
                                       std::set<std::string>* provided) const {
  std::set<std::string> required;
  std::set<std::string> forwards;
  bool have_message = false;
  bool has_extension = false;
  bool has_map = false;
  for (auto desc : scc->descriptors) {
    if (desc->containing_type() == nullptr) {
      FindRequiresForMessage(options, desc, &required, &forwards,
                             &have_message);
      has_extension = (has_extension || HasExtensions(desc));
      has_map = (has_map || HasMap(options, desc));
    }
  }

  GenerateRequiresImpl(options, printer, &required, &forwards, provided,
                       /* require_jspb = */ have_message,
                       /* require_extension = */ has_extension,
                       /* require_map = */ has_map);
}